

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall phosg::Image::save(Image *this,char *filename,Format format)

{
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  allocator<char> local_62;
  allocator<char> local_61;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> local_60;
  string local_50;
  string local_30;
  
  if (filename != (char *)0x0) {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,filename,&local_61);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"wb",&local_62);
    fopen_unique((phosg *)&local_60,&local_30,&local_50,(FILE *)0x0);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_30);
    save(this,local_60._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
              super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
              super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,format);
    ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr(&local_60);
    return;
  }
  save(this,_stdout,format);
  return;
}

Assistant:

void Image::save(const char* filename, Format format) const {
  if (filename) {
    auto f = fopen_unique(filename, "wb");
    this->save(f.get(), format);
  } else {
    this->save(stdout, format);
  }
}